

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleTypeHandler<2UL>::MarshalAllPropertiesToScriptContext
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,ScriptContext *targetScriptContext,
          bool invalidateFixedFields)

{
  Var pvVar1;
  int index;
  
  if (0 < this->propertyCount) {
    index = 0;
    do {
      pvVar1 = DynamicTypeHandler::GetSlot(&this->super_DynamicTypeHandler,instance,index);
      pvVar1 = CrossSite::MarshalVar(targetScriptContext,pvVar1,false);
      DynamicTypeHandler::SetSlotUnchecked(instance,index,pvVar1);
      index = index + 1;
    } while (index < this->propertyCount);
  }
  return;
}

Assistant:

void SimpleTypeHandler<size>::MarshalAllPropertiesToScriptContext(DynamicObject* instance, ScriptContext* targetScriptContext, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.

        // We can ignore invalidateFixedFields, because SimpleTypeHandler doesn't support fixed fields at this point.
        for (int propertyIndex = 0; propertyIndex < this->propertyCount; propertyIndex++)
        {
            SetSlotUnchecked(instance, propertyIndex, CrossSite::MarshalVar(targetScriptContext, GetSlot(instance, propertyIndex)));
        }
    }